

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O1

Wbmp * createwbmp(int width,int height,int color)

{
  int iVar1;
  Wbmp *ptr;
  int *piVar2;
  ulong uVar3;
  
  ptr = (Wbmp *)gdMalloc(0x18);
  if (ptr != (Wbmp *)0x0) {
    iVar1 = overflow2(4,width);
    if (iVar1 == 0) {
      iVar1 = overflow2((int)((long)width * 4),height);
      if (iVar1 == 0) {
        piVar2 = (int *)gdMalloc((long)width * 4 * (long)height);
        ptr->bitmap = piVar2;
        if (piVar2 != (int *)0x0) {
          ptr->width = width;
          ptr->height = height;
          if (height * width < 1) {
            return ptr;
          }
          uVar3 = 0;
          do {
            piVar2[uVar3] = color;
            uVar3 = uVar3 + 1;
          } while ((uint)(height * width) != uVar3);
          return ptr;
        }
      }
    }
    gdFree(ptr);
  }
  return (Wbmp *)0x0;
}

Assistant:

Wbmp *createwbmp(int width, int height, int color)
{
	int i;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof (Wbmp))) == NULL) {
		return (NULL);
	}

	if(overflow2(sizeof(int), width)) {
		gdFree(wbmp);
		return NULL;
	}

	if(overflow2(sizeof(int) * width, height)) {
		gdFree(wbmp);
		return NULL;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * width * height)) == NULL) {
		gdFree(wbmp);
		return NULL;
	}

	wbmp->width = width;
	wbmp->height = height;

	for(i = 0; i < width * height; wbmp->bitmap[i++] = color);

	return wbmp;
}